

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.h
# Opt level: O2

void Catch::Clara::Detail::convertInto<int>(string *_source,int *_dest)

{
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  stringstream ss;
  ostream local_190 [16];
  byte abStack_180 [360];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::operator<<(local_190,(string *)_source);
  std::istream::operator>>((istream *)&ss,_dest);
  if ((abStack_180[*(long *)(_ss + -0x18)] & 5) == 0) {
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_1e0,"Unable to convert ",_source);
  std::operator+(&local_1c0,&local_1e0," to destination type");
  std::runtime_error::runtime_error(this,(string *)&local_1c0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void convertInto( std::string const& _source, T& _dest ) {
            std::stringstream ss;
            ss << _source;
            ss >> _dest;
            if( ss.fail() )
                throw std::runtime_error( "Unable to convert " + _source + " to destination type" );
        }